

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Gecko::Graph::~Graph(Graph *this)

{
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->bond).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->weight).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>::~_Vector_base
            (&(this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

Graph(uint nodes = 0) : level(0), last_node(Node::null) { init(nodes); }